

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipboard.c
# Opt level: O1

char * al_get_clipboard_text(ALLEGRO_DISPLAY *display)

{
  _func_char_ptr_ALLEGRO_DISPLAY_ptr *UNRECOVERED_JUMPTABLE;
  char *pcVar1;
  
  if (display == (ALLEGRO_DISPLAY *)0x0) {
    display = al_get_current_display();
  }
  if ((display != (ALLEGRO_DISPLAY *)0x0) &&
     (UNRECOVERED_JUMPTABLE = display->vt->get_clipboard_text,
     UNRECOVERED_JUMPTABLE != (_func_char_ptr_ALLEGRO_DISPLAY_ptr *)0x0)) {
    pcVar1 = (*UNRECOVERED_JUMPTABLE)(display);
    return pcVar1;
  }
  return (char *)0x0;
}

Assistant:

char *al_get_clipboard_text(ALLEGRO_DISPLAY *display)
{
   if (!display)
      display = al_get_current_display();

   if (!display)
      return NULL;

   if (!display->vt->get_clipboard_text)
      return NULL;

   return display->vt->get_clipboard_text(display);
}